

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

int parse_servercmd(httprequest *req)

{
  uint __errnum;
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  bool bVar4;
  char *local_58;
  char *check;
  size_t sStack_48;
  int num;
  size_t cmdsize;
  char *cmd;
  char *orgcmd;
  char *pcStack_28;
  int error;
  char *filename;
  FILE *stream;
  httprequest *req_local;
  
  stream = (FILE *)req;
  pcStack_28 = test2file(req->testno);
  filename = (char *)fopen64(pcStack_28,"rb");
  if ((FILE *)filename == (FILE *)0x0) {
    puVar2 = (uint *)__errno_location();
    __errnum = *puVar2;
    orgcmd._4_4_ = __errnum;
    pcVar3 = strerror(__errnum);
    logmsg("fopen() failed with error: %d %s",(ulong)__errnum,pcVar3);
    logmsg("  [1] Error opening file: %s",pcStack_28);
    logmsg("  Couldn\'t open test file %ld",stream[0x2b6]._old_offset);
    *(undefined1 *)&stream[0x2b6]._lock = 0;
    req_local._4_4_ = 1;
  }
  else {
    cmd = (char *)0x0;
    cmdsize = 0;
    sStack_48 = 0;
    check._4_4_ = 0;
    orgcmd._4_4_ = getpart(&cmd,&stack0xffffffffffffffb8,"reply","servercmd",(FILE *)filename);
    fclose((FILE *)filename);
    if (orgcmd._4_4_ == 0) {
      *(undefined1 *)&stream[0x2b6].__pad5 = 0;
      cmdsize = (size_t)cmd;
      while (cmdsize != 0 && sStack_48 != 0) {
        iVar1 = strncmp("auth_required",(char *)cmdsize,0xd);
        if (iVar1 == 0) {
          logmsg("instructed to require authorization header");
          *(undefined1 *)((long)&stream[0x2b6]._lock + 1) = 1;
        }
        else {
          iVar1 = strncmp("idle",(char *)cmdsize,4);
          if (iVar1 == 0) {
            logmsg("instructed to idle");
            *(undefined4 *)&stream[0x2b6]._freeres_list = 1;
            *(undefined1 *)&stream[0x2b6]._lock = 1;
          }
          else {
            iVar1 = strncmp("stream",(char *)cmdsize,6);
            if (iVar1 == 0) {
              logmsg("instructed to stream");
              *(undefined4 *)&stream[0x2b6]._freeres_list = 2;
            }
            else {
              iVar1 = strncmp("connection-monitor",(char *)cmdsize,0x12);
              if (iVar1 == 0) {
                logmsg("enabled connection monitoring");
                *(undefined1 *)&stream[0x2b6].__pad5 = 1;
              }
              else {
                iVar1 = strncmp("upgrade",(char *)cmdsize,7);
                if (iVar1 == 0) {
                  logmsg("enabled upgrade to http2");
                  *(undefined1 *)((long)&stream[0x2b6].__pad5 + 1) = 1;
                }
                else {
                  iVar1 = __isoc99_sscanf(cmdsize,"pipe: %d",(long)&check + 4);
                  if (iVar1 == 1) {
                    logmsg("instructed to allow a pipe size of %d",(ulong)check._4_4_);
                    if ((int)check._4_4_ < 0) {
                      logmsg("negative pipe size ignored");
                    }
                    else if (0 < (int)check._4_4_) {
                      *(uint *)&stream[0x2b6]._wide_data = check._4_4_ - 1;
                    }
                  }
                  else {
                    iVar1 = __isoc99_sscanf(cmdsize,"skip: %d",(long)&check + 4);
                    if (iVar1 == 1) {
                      logmsg("instructed to skip this number of bytes %d",(ulong)check._4_4_);
                      *(uint *)((long)&stream[0x2b6]._wide_data + 4) = check._4_4_;
                    }
                    else {
                      iVar1 = __isoc99_sscanf(cmdsize,"writedelay: %d",(long)&check + 4);
                      if (iVar1 == 1) {
                        logmsg("instructed to delay %d secs between packets",(ulong)check._4_4_);
                        *(uint *)((long)&stream[0x2b6]._codecvt + 4) = check._4_4_;
                      }
                      else {
                        logmsg("Unknown <servercmd> instruction found: %s",cmdsize);
                      }
                    }
                  }
                }
              }
            }
          }
        }
        local_58 = strchr((char *)cmdsize,0xd);
        if (local_58 == (char *)0x0) {
          local_58 = strchr((char *)cmdsize,10);
        }
        if (local_58 == (char *)0x0) break;
        while( true ) {
          bVar4 = true;
          if (*local_58 != '\r') {
            bVar4 = *local_58 == '\n';
          }
          if (!bVar4) break;
          local_58 = local_58 + 1;
        }
        if (*local_58 == '\0') break;
        cmdsize = (size_t)local_58;
      }
      free(cmd);
      req_local._4_4_ = 0;
    }
    else {
      logmsg("getpart() failed with error: %d",(ulong)orgcmd._4_4_);
      *(undefined1 *)&stream[0x2b6]._lock = 0;
      req_local._4_4_ = 1;
    }
  }
  return req_local._4_4_;
}

Assistant:

static int parse_servercmd(struct httprequest *req)
{
  FILE *stream;
  char *filename;
  int error;

  filename = test2file(req->testno);

  stream = fopen(filename, "rb");
  if(!stream) {
    error = errno;
    logmsg("fopen() failed with error: %d %s", error, strerror(error));
    logmsg("  [1] Error opening file: %s", filename);
    logmsg("  Couldn't open test file %ld", req->testno);
    req->open = FALSE; /* closes connection */
    return 1; /* done */
  }
  else {
    char *orgcmd = NULL;
    char *cmd = NULL;
    size_t cmdsize = 0;
    int num = 0;

    /* get the custom server control "commands" */
    error = getpart(&orgcmd, &cmdsize, "reply", "servercmd", stream);
    fclose(stream);
    if(error) {
      logmsg("getpart() failed with error: %d", error);
      req->open = FALSE; /* closes connection */
      return 1; /* done */
    }

    req->connmon = FALSE;

    cmd = orgcmd;
    while(cmd && cmdsize) {
      char *check;

      if(!strncmp(CMD_AUTH_REQUIRED, cmd, strlen(CMD_AUTH_REQUIRED))) {
        logmsg("instructed to require authorization header");
        req->auth_req = TRUE;
      }
      else if(!strncmp(CMD_IDLE, cmd, strlen(CMD_IDLE))) {
        logmsg("instructed to idle");
        req->rcmd = RCMD_IDLE;
        req->open = TRUE;
      }
      else if(!strncmp(CMD_STREAM, cmd, strlen(CMD_STREAM))) {
        logmsg("instructed to stream");
        req->rcmd = RCMD_STREAM;
      }
      else if(!strncmp(CMD_CONNECTIONMONITOR, cmd,
                       strlen(CMD_CONNECTIONMONITOR))) {
        logmsg("enabled connection monitoring");
        req->connmon = TRUE;
      }
      else if(!strncmp(CMD_UPGRADE, cmd, strlen(CMD_UPGRADE))) {
        logmsg("enabled upgrade to http2");
        req->upgrade = TRUE;
      }
      else if(1 == sscanf(cmd, "pipe: %d", &num)) {
        logmsg("instructed to allow a pipe size of %d", num);
        if(num < 0)
          logmsg("negative pipe size ignored");
        else if(num > 0)
          req->pipe = num-1; /* decrease by one since we don't count the
                                first request in this number */
      }
      else if(1 == sscanf(cmd, "skip: %d", &num)) {
        logmsg("instructed to skip this number of bytes %d", num);
        req->skip = num;
      }
      else if(1 == sscanf(cmd, "writedelay: %d", &num)) {
        logmsg("instructed to delay %d secs between packets", num);
        req->writedelay = num;
      }
      else {
        logmsg("Unknown <servercmd> instruction found: %s", cmd);
      }
      /* try to deal with CRLF or just LF */
      check = strchr(cmd, '\r');
      if(!check)
        check = strchr(cmd, '\n');

      if(check) {
        /* get to the letter following the newline */
        while((*check == '\r') || (*check == '\n'))
          check++;

        if(!*check)
          /* if we reached a zero, get out */
          break;
        cmd = check;
      }
      else
        break;
    }
    free(orgcmd);
  }

  return 0; /* OK! */
}